

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

string * __thiscall pbrt::Token::ToString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (this->token)._M_str;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->token)._M_len);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<std::__cxx11::string,pbrt::FileLoc_const&>
            (__return_storage_ptr__,"[ Token token: %s loc: %s ]",&local_48,&this->loc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Token::ToString() const {
    return StringPrintf("[ Token token: %s loc: %s ]", toString(token), loc);
}